

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O2

void __thiscall
SkylineBinPack::AddSkylineLevel(SkylineBinPack *this,int skylineNodeIndex,Rect *rect)

{
  TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode> *this_00;
  SkylineNode *pSVar1;
  int in_ECX;
  int iVar2;
  int iVar3;
  uint index;
  SkylineNode newNode;
  SkylineNode local_34;
  
  if (this->useWasteMap == true) {
    AddWasteMapArea(this,skylineNodeIndex,rect->width,in_ECX,rect->y);
  }
  local_34.x = rect->x;
  local_34.y = rect->height + rect->y;
  local_34.width = rect->width;
  this_00 = &this->skyLine;
  TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Insert
            (this_00,skylineNodeIndex,&local_34);
  if (this->binWidth < local_34.width + local_34.x) {
    __assert_fail("newNode.x + newNode.width <= binWidth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                  ,0xe1,"void SkylineBinPack::AddSkylineLevel(int, const Rect &)");
  }
  if (this->binHeight < local_34.y) {
    __assert_fail("newNode.y <= binHeight",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                  ,0xe2,"void SkylineBinPack::AddSkylineLevel(int, const Rect &)");
  }
  index = skylineNodeIndex + 1;
  while (index < (this->skyLine).Count) {
    pSVar1 = this_00->Array;
    iVar2 = pSVar1[index].x;
    if (iVar2 < pSVar1[(uint)skylineNodeIndex].x) {
      __assert_fail("skyLine[i-1].x <= skyLine[i].x",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                    ,0xe6,"void SkylineBinPack::AddSkylineLevel(int, const Rect &)");
    }
    iVar3 = pSVar1[(uint)skylineNodeIndex].x + pSVar1[(uint)skylineNodeIndex].width;
    if (iVar3 <= iVar2) break;
    pSVar1 = pSVar1 + index;
    pSVar1->x = iVar3;
    iVar2 = (iVar2 - iVar3) + pSVar1->width;
    pSVar1->width = iVar2;
    if (0 < iVar2) break;
    TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Delete(this_00,index);
  }
  MergeSkylines(this);
  return;
}

Assistant:

void SkylineBinPack::AddSkylineLevel(int skylineNodeIndex, const Rect &rect)
{
	// First track all wasted areas and mark them into the waste map if we're using one.
	if (useWasteMap)
		AddWasteMapArea(skylineNodeIndex, rect.width, rect.height, rect.y);

	SkylineNode newNode;
	newNode.x = rect.x;
	newNode.y = rect.y + rect.height;
	newNode.width = rect.width;
	skyLine.Insert(skylineNodeIndex, newNode);

	assert(newNode.x + newNode.width <= binWidth);
	assert(newNode.y <= binHeight);

	for(unsigned i = skylineNodeIndex+1; i < skyLine.Size(); ++i)
	{
		assert(skyLine[i-1].x <= skyLine[i].x);

		if (skyLine[i].x < skyLine[i-1].x + skyLine[i-1].width)
		{
			int shrink = skyLine[i-1].x + skyLine[i-1].width - skyLine[i].x;

			skyLine[i].x += shrink;
			skyLine[i].width -= shrink;

			if (skyLine[i].width <= 0)
			{
				skyLine.Delete(i);
				--i;
			}
			else
				break;
		}
		else
			break;
	}
	MergeSkylines();
}